

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O2

RK_S32 exp_golomb_signed(RK_S32 val)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  
  bVar4 = 1;
  uVar2 = val * -2 + 1;
  if (0 < val) {
    uVar2 = val * 2;
  }
  iVar3 = -1;
  do {
    bVar1 = bVar4 & 0x1f;
    iVar3 = iVar3 + 2;
    bVar4 = bVar4 + 1;
  } while (uVar2 >> bVar1 != 0);
  return iVar3;
}

Assistant:

RK_S32 exp_golomb_signed(RK_S32 val)
{
    RK_S32 tmp = 0;

    if (val > 0)
        val = 2 * val;
    else
        val = -2 * val + 1;

    while (val >> ++tmp)
        ;

    return tmp * 2 - 1;
}